

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gp3p::groebnerRow10_000000_f
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  lVar10 = (long)targetRow;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[lVar10 + 0xc60];
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar12,auVar9);
  auVar13._0_8_ =
       auVar11._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xc6a];
  auVar13._8_8_ = auVar11._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xc60] = 0.0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd2a];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[lVar10 + 0xd20];
  auVar11 = vfmadd213sd_fma(auVar14,auVar13,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xd20] = auVar11._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd5a];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xd50];
  auVar11 = vfmadd213sd_fma(auVar15,auVar13,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xd50] = auVar11._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe1a];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xe10];
  auVar11 = vfmadd213sd_fma(auVar16,auVar13,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xe10] = auVar11._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe4a];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xe40];
  auVar11 = vfmadd213sd_fma(auVar17,auVar13,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xe40] = auVar11._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe7a];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xe70];
  auVar11 = vfmadd213sd_fma(auVar18,auVar13,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xe70] = auVar11._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf3a];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xf30];
  auVar11 = vfmadd213sd_fma(auVar19,auVar13,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xf30] = auVar11._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf6a];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xf60];
  auVar11 = vfmadd213sd_fma(auVar20,auVar13,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xf60] = auVar11._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf9a];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xf90];
  auVar11 = vfmadd213sd_fma(auVar21,auVar13,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xf90] = auVar11._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfca];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar10 + 0xfc0];
  auVar11 = vfmadd213sd_fma(auVar22,auVar13,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar10 + 0xfc0] = auVar11._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::groebnerRow10_000000_f( Eigen::Matrix<double,48,85> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,66) / groebnerMatrix(10,66);
  groebnerMatrix(targetRow,66) = 0.0;
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(10,70);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(10,71);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(10,75);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(10,76);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(10,77);
  groebnerMatrix(targetRow,81) -= factor * groebnerMatrix(10,81);
  groebnerMatrix(targetRow,82) -= factor * groebnerMatrix(10,82);
  groebnerMatrix(targetRow,83) -= factor * groebnerMatrix(10,83);
  groebnerMatrix(targetRow,84) -= factor * groebnerMatrix(10,84);
}